

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

void * metacall_await(char *name,void **args,_func_void_ptr_void_ptr_void_ptr *resolve_callback,
                     _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  type_id tVar1;
  loader_data v;
  function func;
  signature s;
  size_t size;
  function_return pvVar2;
  
  v = loader_get(name);
  tVar1 = value_type_id(v);
  if (tVar1 == 0xd) {
    func = value_to_function(v);
  }
  else {
    func = (function_conflict)0x0;
  }
  s = function_signature(func);
  size = signature_count(s);
  pvVar2 = function_await(func,args,size,(function_resolve_callback)resolve_callback,
                          (function_reject_callback)reject_callback,data);
  return pvVar2;
}

Assistant:

void *metacall_await(const char *name, void *args[], void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	value f_val = loader_get(name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	signature s = function_signature(f);

	return function_await(f, args, signature_count(s), resolve_callback, reject_callback, data);
}